

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtCompoundCollisionAlgorithm::processCollision
          (cbtCompoundCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  cbtCollisionShape *pcVar19;
  cbtPersistentManifold **ppcVar20;
  cbtCollisionAlgorithm *pcVar21;
  cbtPersistentManifold *this_00;
  cbtTransform *pcVar22;
  void *pvVar23;
  cbtDispatcher *pcVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  cbtCollisionObjectWrapper *pcVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  cbtCollisionObjectWrapper *pcVar33;
  cbtCollisionObject *pcVar34;
  int curSize;
  int iVar35;
  cbtCollisionObject *pcVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  cbtDbvt *this_01;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  cbtVector3 localAabbMax;
  cbtVector3 localAabbMin;
  cbtVector3 aabbMax1;
  cbtCompoundLeafCallback callback;
  cbtDbvtVolume bounds;
  float local_130;
  float fStack_12c;
  float fStack_128;
  cbtScalar cStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  cbtScalar cStack_114;
  cbtDbvt *local_110;
  float local_108;
  float local_104;
  float local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  cbtCompoundLeafCallback local_b8;
  cbtDbvtVolume local_78;
  uint local_58;
  uint uStack_54;
  uint local_50;
  float local_48;
  float local_44;
  float local_40;
  
  pcVar33 = body1Wrap;
  pcVar29 = body0Wrap;
  if (this->m_isSwapped != false) {
    pcVar33 = body0Wrap;
    pcVar29 = body1Wrap;
  }
  pcVar19 = pcVar29->m_shape;
  if (pcVar19[3].m_shapeType != this->m_compoundShapeRevision) {
    removeChildAlgorithms(this);
    preallocateChildAlgorithms(this,body0Wrap,body1Wrap);
    this->m_compoundShapeRevision = pcVar19[3].m_shapeType;
  }
  if ((this->m_childCollisionAlgorithms).m_size != 0) {
    this_01 = (cbtDbvt *)pcVar19[3]._vptr_cbtCollisionShape;
    local_b8.m_dispatcher =
         (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    local_b8.m_childCollisionAlgorithms = (this->m_childCollisionAlgorithms).m_data;
    local_b8.m_sharedManifold = this->m_sharedManifold;
    local_b8.super_ICollide._vptr_ICollide = (_func_int **)&PTR__ICollide_00b703f8;
    iVar35 = (this->manifoldArray).m_size;
    lVar37 = (long)iVar35;
    local_b8.m_compoundColObjWrap = pcVar29;
    local_b8.m_otherObjWrap = pcVar33;
    local_b8.m_dispatchInfo = dispatchInfo;
    local_b8.m_resultOut = resultOut;
    if ((lVar37 < 1) && (iVar35 < 0)) {
      if ((this->manifoldArray).m_capacity < 0) {
        ppcVar20 = (this->manifoldArray).m_data;
        if (ppcVar20 != (cbtPersistentManifold **)0x0) {
          if ((this->manifoldArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ppcVar20);
          }
          (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        }
        (this->manifoldArray).m_ownsMemory = true;
        (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        (this->manifoldArray).m_capacity = 0;
      }
      if (iVar35 < 0) {
        do {
          (this->manifoldArray).m_data[lVar37] = (cbtPersistentManifold *)0x0;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 0);
      }
    }
    (this->manifoldArray).m_size = 0;
    uVar32 = (this->m_childCollisionAlgorithms).m_size;
    if (0 < (int)uVar32) {
      lVar37 = 0;
      local_110 = this_01;
      do {
        pcVar21 = (this->m_childCollisionAlgorithms).m_data[lVar37];
        if (pcVar21 != (cbtCollisionAlgorithm *)0x0) {
          (*pcVar21->_vptr_cbtCollisionAlgorithm[4])(pcVar21,&this->manifoldArray);
          iVar35 = (this->manifoldArray).m_size;
          if (0 < iVar35) {
            lVar39 = 0;
            do {
              this_00 = (this->manifoldArray).m_data[lVar39];
              if (this_00->m_cachedPoints != 0) {
                resultOut->m_manifoldPtr = this_00;
                pcVar36 = resultOut->m_body0Wrap->m_collisionObject;
                if (this_00->m_body0 == pcVar36) {
                  pcVar34 = resultOut->m_body1Wrap->m_collisionObject;
                }
                else {
                  pcVar34 = pcVar36;
                  pcVar36 = resultOut->m_body1Wrap->m_collisionObject;
                }
                cbtPersistentManifold::refreshContactPoints
                          (this_00,&pcVar36->m_worldTransform,&pcVar34->m_worldTransform);
                resultOut->m_manifoldPtr = (cbtPersistentManifold *)0x0;
              }
              lVar39 = lVar39 + 1;
              iVar35 = (this->manifoldArray).m_size;
            } while (lVar39 < iVar35);
          }
          if ((iVar35 < 1) && (iVar35 < 0)) {
            if ((this->manifoldArray).m_capacity < 0) {
              ppcVar20 = (this->manifoldArray).m_data;
              if (ppcVar20 != (cbtPersistentManifold **)0x0) {
                if ((this->manifoldArray).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ppcVar20);
                }
                (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
              }
              (this->manifoldArray).m_ownsMemory = true;
              (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
              (this->manifoldArray).m_capacity = 0;
            }
            if (iVar35 < 0) {
              lVar39 = (long)iVar35;
              do {
                (this->manifoldArray).m_data[lVar39] = (cbtPersistentManifold *)0x0;
                lVar39 = lVar39 + 1;
              } while (lVar39 != 0);
            }
          }
          (this->manifoldArray).m_size = 0;
        }
        lVar37 = lVar37 + 1;
        uVar32 = (this->m_childCollisionAlgorithms).m_size;
        this_01 = local_110;
      } while (lVar37 < (int)uVar32);
    }
    if (this_01 == (cbtDbvt *)0x0) {
      if (0 < (int)uVar32) {
        lVar37 = 0x40;
        uVar38 = 0;
        do {
          cbtCompoundLeafCallback::ProcessChildShape
                    (&local_b8,*(cbtCollisionShape **)((long)pcVar19[1].m_userPointer + lVar37),
                     (int)uVar38);
          uVar38 = uVar38 + 1;
          lVar37 = lVar37 + 0x58;
        } while (uVar32 != uVar38);
      }
    }
    else {
      cbtTransform::inverse(pcVar29->m_worldTransform);
      pcVar22 = pcVar33->m_worldTransform;
      fVar1 = (pcVar22->m_basis).m_el[1].m_floats[0];
      cVar2 = (pcVar22->m_basis).m_el[0].m_floats[0];
      cVar3 = (pcVar22->m_basis).m_el[0].m_floats[1];
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_78.mi.m_floats[1])),
                                ZEXT416((uint)cVar2),ZEXT416((uint)local_78.mi.m_floats[0]));
      cVar4 = (pcVar22->m_basis).m_el[2].m_floats[0];
      auVar25 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar4),ZEXT416((uint)local_78.mi.m_floats[2]))
      ;
      fVar5 = (pcVar22->m_basis).m_el[1].m_floats[1];
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_78.mi.m_floats[1])),
                                ZEXT416((uint)cVar3),ZEXT416((uint)local_78.mi.m_floats[0]));
      cVar6 = (pcVar22->m_basis).m_el[2].m_floats[1];
      auVar26 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar6),ZEXT416((uint)local_78.mi.m_floats[2]))
      ;
      cVar7 = (pcVar22->m_basis).m_el[0].m_floats[2];
      fVar8 = (pcVar22->m_basis).m_el[1].m_floats[2];
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_78.mi.m_floats[1])),
                                ZEXT416((uint)cVar7),ZEXT416((uint)local_78.mi.m_floats[0]));
      cVar9 = (pcVar22->m_basis).m_el[2].m_floats[2];
      auVar27 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar9),ZEXT416((uint)local_78.mi.m_floats[2]))
      ;
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)local_78.mx.m_floats[1]));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar2),
                                    ZEXT416((uint)local_78.mx.m_floats[0]));
      auVar41 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar4),
                                    ZEXT416((uint)local_78.mx.m_floats[2]));
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)local_78.mx.m_floats[1]));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar3),
                                    ZEXT416((uint)local_78.mx.m_floats[0]));
      auVar42 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar6),
                                    ZEXT416((uint)local_78.mx.m_floats[2]));
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)local_78.mx.m_floats[1]));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar7),
                                    ZEXT416((uint)local_78.mx.m_floats[0]));
      auVar43 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar9),
                                    ZEXT416((uint)local_78.mx.m_floats[2]));
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(uStack_54));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(local_58),ZEXT416((uint)cVar2));
      auVar28 = vfmadd231ss_fma(auVar40,ZEXT416(local_50),ZEXT416((uint)cVar4));
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uStack_54));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(local_58),ZEXT416((uint)cVar3));
      auVar46 = vfmadd231ss_fma(auVar40,ZEXT416(local_50),ZEXT416((uint)cVar6));
      auVar40 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uStack_54));
      auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(local_58),ZEXT416((uint)cVar7));
      auVar47 = vfmadd231ss_fma(auVar40,ZEXT416(local_50),ZEXT416((uint)cVar9));
      cVar2 = (pcVar22->m_origin).m_floats[0];
      fVar1 = (pcVar22->m_origin).m_floats[1];
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_78.mi.m_floats[1])),
                                ZEXT416((uint)cVar2),ZEXT416((uint)local_78.mi.m_floats[0]));
      cVar3 = (pcVar22->m_origin).m_floats[2];
      auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar3),ZEXT416((uint)local_78.mi.m_floats[2]))
      ;
      auVar44 = vmulss_avx512f(ZEXT416((uint)local_78.mx.m_floats[1]),ZEXT416((uint)fVar1));
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar2),ZEXT416((uint)local_78.mx.m_floats[0]))
      ;
      auVar45 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar3),
                                    ZEXT416((uint)local_78.mx.m_floats[2]));
      auVar44 = vmulss_avx512f(ZEXT416(uStack_54),ZEXT416((uint)fVar1));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar2),ZEXT416(local_58));
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar3),ZEXT416(local_50));
      auVar40 = vinsertps_avx(ZEXT416((uint)(auVar40._0_4_ + local_48)),
                              ZEXT416((uint)(auVar45._0_4_ + local_44)),0x10);
      local_c8 = vinsertps_avx(auVar40,ZEXT416((uint)(auVar44._0_4_ + local_40)),0x28);
      local_f8 = auVar25._0_4_;
      local_f4 = auVar26._0_4_;
      local_f0 = auVar27._0_4_;
      local_ec = 0;
      local_e8 = auVar41._0_4_;
      local_e4 = auVar42._0_4_;
      local_e0 = auVar43._0_4_;
      local_dc = 0;
      local_d8 = auVar28._0_4_;
      local_d4 = auVar46._0_4_;
      local_d0 = auVar47._0_4_;
      local_cc = 0;
      (*pcVar33->m_shape->_vptr_cbtCollisionShape[2])
                (pcVar33->m_shape,&local_f8,&local_120,&local_130);
      fVar1 = resultOut->m_closestPointDistanceThreshold;
      local_120 = local_120 - fVar1;
      fStack_11c = fStack_11c - fVar1;
      fStack_118 = fStack_118 - fVar1;
      local_130 = fVar1 + local_130;
      fStack_12c = fVar1 + fStack_12c;
      fStack_128 = fVar1 + fStack_128;
      local_78.mi.m_floats[1] = fStack_11c;
      local_78.mi.m_floats[0] = local_120;
      local_78.mi.m_floats[3] = cStack_114;
      local_78.mi.m_floats[2] = fStack_118;
      local_78.mx.m_floats[1] = fStack_12c;
      local_78.mx.m_floats[0] = local_130;
      local_78.mx.m_floats[3] = cStack_124;
      local_78.mx.m_floats[2] = fStack_128;
      cbtDbvt::collideTVNoStackAlloc
                (this_01,this_01->m_root,&local_78,&this->stack2,&local_b8.super_ICollide);
    }
    uVar32 = (this->m_childCollisionAlgorithms).m_size;
    iVar35 = (this->manifoldArray).m_size;
    lVar37 = (long)iVar35;
    if ((lVar37 < 1) && (iVar35 < 0)) {
      if ((this->manifoldArray).m_capacity < 0) {
        ppcVar20 = (this->manifoldArray).m_data;
        if (ppcVar20 != (cbtPersistentManifold **)0x0) {
          if ((this->manifoldArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ppcVar20);
          }
          (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        }
        (this->manifoldArray).m_ownsMemory = true;
        (this->manifoldArray).m_data = (cbtPersistentManifold **)0x0;
        (this->manifoldArray).m_capacity = 0;
      }
      if (iVar35 < 0) {
        do {
          (this->manifoldArray).m_data[lVar37] = (cbtPersistentManifold *)0x0;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 0);
      }
    }
    (this->manifoldArray).m_size = 0;
    if (0 < (int)uVar32) {
      lVar37 = 0x40;
      uVar38 = 0;
      do {
        if ((this->m_childCollisionAlgorithms).m_data[uVar38] != (cbtCollisionAlgorithm *)0x0) {
          pvVar23 = pcVar19[1].m_userPointer;
          pcVar22 = pcVar29->m_worldTransform;
          cVar2 = (pcVar22->m_basis).m_el[0].m_floats[0];
          fVar1 = (pcVar22->m_basis).m_el[0].m_floats[1];
          cVar3 = (pcVar22->m_basis).m_el[0].m_floats[2];
          cVar4 = (pcVar22->m_basis).m_el[1].m_floats[0];
          fVar5 = (pcVar22->m_basis).m_el[1].m_floats[1];
          cVar6 = (pcVar22->m_basis).m_el[1].m_floats[2];
          cVar7 = (pcVar22->m_basis).m_el[2].m_floats[0];
          fVar8 = (pcVar22->m_basis).m_el[2].m_floats[1];
          cVar9 = (pcVar22->m_basis).m_el[2].m_floats[2];
          fVar10 = *(float *)((long)pvVar23 + lVar37 + -0x30);
          uVar11 = *(uint *)((long)pvVar23 + lVar37 + -0x40);
          uVar12 = *(uint *)((long)pvVar23 + lVar37 + -0x3c);
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar10)),ZEXT416(uVar11),
                                    ZEXT416((uint)cVar2));
          uVar13 = *(uint *)((long)pvVar23 + lVar37 + -0x20);
          auVar25 = vfmadd231ss_fma(auVar40,ZEXT416(uVar13),ZEXT416((uint)cVar3));
          fVar14 = *(float *)((long)pvVar23 + lVar37 + -0x2c);
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar14)),ZEXT416(uVar12),
                                    ZEXT416((uint)cVar2));
          uVar15 = *(uint *)((long)pvVar23 + lVar37 + -0x1c);
          auVar46 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar15),ZEXT416((uint)cVar3));
          uVar16 = *(uint *)((long)pvVar23 + lVar37 + -0x38);
          uVar17 = *(uint *)((long)pvVar23 + lVar37 + -0x28);
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(uVar17));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar16),ZEXT416((uint)cVar2));
          uVar18 = *(uint *)((long)pvVar23 + lVar37 + -0x18);
          auVar47 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar18),ZEXT416((uint)cVar3));
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar10));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar11),ZEXT416((uint)cVar4));
          auVar44 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar13),ZEXT416((uint)cVar6));
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar14));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar12),ZEXT416((uint)cVar4));
          auVar41 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar15),ZEXT416((uint)cVar6));
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uVar17));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar16),ZEXT416((uint)cVar4));
          auVar42 = vfmadd231ss_avx512f(auVar40,ZEXT416(uVar18),ZEXT416((uint)cVar6));
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)cVar7),
                                    ZEXT416(uVar11));
          auVar26 = vfmadd231ss_fma(auVar40,ZEXT416((uint)cVar9),ZEXT416(uVar13));
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar8)),ZEXT416((uint)cVar7),
                                    ZEXT416(uVar12));
          auVar43 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar9),ZEXT416(uVar15));
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uVar17));
          auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar7),ZEXT416(uVar16));
          auVar45 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar9),ZEXT416(uVar18));
          uVar11 = *(uint *)((long)pvVar23 + lVar37 + -0x10);
          fVar10 = *(float *)((long)pvVar23 + lVar37 + -0xc);
          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar10)),ZEXT416(uVar11),
                                    ZEXT416((uint)cVar2));
          uVar12 = *(uint *)((long)pvVar23 + lVar37 + -8);
          auVar40 = vfmadd231ss_fma(auVar40,ZEXT416(uVar12),ZEXT416((uint)cVar3));
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar10)),ZEXT416(uVar11),
                                    ZEXT416((uint)cVar4));
          auVar27 = vfmadd231ss_fma(auVar27,ZEXT416(uVar12),ZEXT416((uint)cVar6));
          auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416(uVar11),
                                    ZEXT416((uint)cVar7));
          auVar28 = vfmadd231ss_fma(auVar28,ZEXT416(uVar12),ZEXT416((uint)cVar9));
          auVar40 = vinsertps_avx(ZEXT416((uint)(auVar40._0_4_ + (pcVar22->m_origin).m_floats[0])),
                                  ZEXT416((uint)(auVar27._0_4_ + (pcVar22->m_origin).m_floats[1])),
                                  0x10);
          local_c8 = vinsertps_avx(auVar40,ZEXT416((uint)(auVar28._0_4_ +
                                                         (pcVar22->m_origin).m_floats[2])),0x28);
          local_f8 = auVar25._0_4_;
          local_f4 = auVar46._0_4_;
          local_f0 = auVar47._0_4_;
          local_ec = 0;
          local_e8 = auVar44._0_4_;
          local_e4 = auVar41._0_4_;
          local_e0 = auVar42._0_4_;
          local_dc = 0;
          local_d8 = auVar26._0_4_;
          local_d4 = auVar43._0_4_;
          local_d0 = auVar45._0_4_;
          local_cc = 0;
          (**(code **)(**(long **)((long)pvVar23 + lVar37) + 0x10))
                    (*(long **)((long)pvVar23 + lVar37),&local_f8,&local_78,&local_120);
          (*pcVar33->m_shape->_vptr_cbtCollisionShape[2])
                    (pcVar33->m_shape,pcVar33->m_worldTransform,&local_130,&local_108);
          bVar30 = 1;
          if ((local_78.mi.m_floats[0] <= local_108) && (bVar30 = 1, local_130 <= local_120)) {
            bVar30 = 0;
          }
          bVar31 = 1;
          if ((local_78.mi.m_floats[2] <= local_100) && (fStack_128 <= fStack_118)) {
            bVar31 = bVar30;
          }
          if ((local_104 < local_78.mi.m_floats[1]) || (!(bool)(~bVar31 & fStack_12c <= fStack_11c))
             ) {
            (**(this->m_childCollisionAlgorithms).m_data[uVar38]->_vptr_cbtCollisionAlgorithm)();
            pcVar24 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
                      m_dispatcher;
            (*pcVar24->_vptr_cbtDispatcher[0xf])
                      (pcVar24,(this->m_childCollisionAlgorithms).m_data[uVar38]);
            (this->m_childCollisionAlgorithms).m_data[uVar38] = (cbtCollisionAlgorithm *)0x0;
          }
        }
        uVar38 = uVar38 + 1;
        lVar37 = lVar37 + 0x58;
      } while (uVar32 != uVar38);
    }
  }
  return;
}

Assistant:

void cbtCompoundCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	const cbtCollisionObjectWrapper* colObjWrap = m_isSwapped ? body1Wrap : body0Wrap;
	const cbtCollisionObjectWrapper* otherObjWrap = m_isSwapped ? body0Wrap : body1Wrap;

	cbtAssert(colObjWrap->getCollisionShape()->isCompound());
	const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(colObjWrap->getCollisionShape());

	///cbtCompoundShape might have changed:
	////make sure the internal child collision algorithm caches are still valid
	if (compoundShape->getUpdateRevision() != m_compoundShapeRevision)
	{
		///clear and update all
		removeChildAlgorithms();

		preallocateChildAlgorithms(body0Wrap, body1Wrap);
		m_compoundShapeRevision = compoundShape->getUpdateRevision();
	}

	if (m_childCollisionAlgorithms.size() == 0)
		return;

	const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
	//use a dynamic aabb tree to cull potential child-overlaps
	cbtCompoundLeafCallback callback(colObjWrap, otherObjWrap, m_dispatcher, dispatchInfo, resultOut, &m_childCollisionAlgorithms[0], m_sharedManifold);

	///we need to refresh all contact manifolds
	///note that we should actually recursively traverse all children, cbtCompoundShape can nested more then 1 level deep
	///so we should add a 'refreshManifolds' in the cbtCollisionAlgorithm
	{
		int i;
		manifoldArray.resize(0);
		for (i = 0; i < m_childCollisionAlgorithms.size(); i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				m_childCollisionAlgorithms[i]->getAllContactManifolds(manifoldArray);
				for (int m = 0; m < manifoldArray.size(); m++)
				{
					if (manifoldArray[m]->getNumContacts())
					{
						resultOut->setPersistentManifold(manifoldArray[m]);
						resultOut->refreshContactPoints();
						resultOut->setPersistentManifold(0);  //??necessary?
					}
				}
				manifoldArray.resize(0);
			}
		}
	}

	if (tree)
	{
		cbtVector3 localAabbMin, localAabbMax;
		cbtTransform otherInCompoundSpace;
		otherInCompoundSpace = colObjWrap->getWorldTransform().inverse() * otherObjWrap->getWorldTransform();
		otherObjWrap->getCollisionShape()->getAabb(otherInCompoundSpace, localAabbMin, localAabbMax);
		cbtVector3 extraExtends(resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold, resultOut->m_closestPointDistanceThreshold);
		localAabbMin -= extraExtends;
		localAabbMax += extraExtends;

		const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(localAabbMin, localAabbMax);
		//process all children, that overlap with  the given AABB bounds
		tree->collideTVNoStackAlloc(tree->m_root, bounds, stack2, callback);
	}
	else
	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		for (i = 0; i < numChildren; i++)
		{
			callback.ProcessChildShape(compoundShape->getChildShape(i), i);
		}
	}

	{
		//iterate over all children, perform an AABB check inside ProcessChildShape
		int numChildren = m_childCollisionAlgorithms.size();
		int i;
		manifoldArray.resize(0);
		const cbtCollisionShape* childShape = 0;
		cbtTransform orgTrans;

		cbtTransform newChildWorldTrans;
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;

		for (i = 0; i < numChildren; i++)
		{
			if (m_childCollisionAlgorithms[i])
			{
				childShape = compoundShape->getChildShape(i);
				//if not longer overlapping, remove the algorithm
				orgTrans = colObjWrap->getWorldTransform();

				const cbtTransform& childTrans = compoundShape->getChildTransform(i);
				newChildWorldTrans = orgTrans * childTrans;

				//perform an AABB check first
				childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);
				otherObjWrap->getCollisionShape()->getAabb(otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);

				if (!TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
				{
					m_childCollisionAlgorithms[i]->~cbtCollisionAlgorithm();
					m_dispatcher->freeCollisionAlgorithm(m_childCollisionAlgorithms[i]);
					m_childCollisionAlgorithms[i] = 0;
				}
			}
		}
	}
}